

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_structure.h
# Opt level: O3

void __thiscall xLearn::DMatrix::Serialize(DMatrix *this,string *filename)

{
  FILE *file;
  ostream *poVar1;
  ulong uVar2;
  Logger local_6c;
  string local_68;
  string local_48;
  
  if (filename->_M_string_length == 0) {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    local_6c.severity_ = ERR;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/data_structure.h"
               ,"");
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"Serialize","");
    poVar1 = Logger::Start(ERR,&local_48,0x14e,&local_68);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"CHECK_NE failed ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/data_structure.h"
               ,0x5c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,":",1);
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,0x14e);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"filename.empty()",0x10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," = ",3);
    poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"true",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," = ",3);
    poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
    std::operator<<(poVar1,"\n");
  }
  else {
    uVar2 = (ulong)this->row_length;
    if ((long)(this->row).
              super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->row).
              super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_start >> 3 == uVar2) {
      if ((long)(this->Y).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->Y).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start >> 2 == uVar2) {
        if ((long)(this->norm).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this->norm).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start >> 2 == uVar2) {
          file = OpenFileOrDie((filename->_M_dataplus)._M_p,"w");
          WriteDataToDisk(file,(char *)this,8);
          WriteDataToDisk(file,(char *)&this->hash_value_2,8);
          WriteDataToDisk(file,(char *)&this->row_length,4);
          if (this->row_length != 0) {
            uVar2 = 0;
            do {
              WriteVectorToFile<xLearn::Node>
                        (file,(this->row).
                              super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar2]);
              uVar2 = uVar2 + 1;
            } while (uVar2 < this->row_length);
          }
          WriteVectorToFile<float>(file,&this->Y);
          WriteVectorToFile<float>(file,&this->norm);
          WriteDataToDisk(file,&this->has_label,1);
          WriteDataToDisk(file,(char *)&this->pos,4);
          Close(file);
          return;
        }
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        local_6c.severity_ = ERR;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_48,
                   "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/data_structure.h"
                   ,"");
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"Serialize","");
        poVar1 = Logger::Start(ERR,&local_48,0x151,&local_68);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"CHECK_EQ failed ",0x10);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar1,
                   "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/data_structure.h"
                   ,0x5c);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,":",1);
        poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,0x151);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"row_length",10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1," = ",3);
        poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"norm.size()",0xb);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1," = ",3);
        poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::operator<<(poVar1,"\n");
      }
      else {
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        local_6c.severity_ = ERR;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_48,
                   "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/data_structure.h"
                   ,"");
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"Serialize","");
        poVar1 = Logger::Start(ERR,&local_48,0x150,&local_68);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"CHECK_EQ failed ",0x10);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar1,
                   "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/data_structure.h"
                   ,0x5c);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,":",1);
        poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,0x150);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"row_length",10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1," = ",3);
        poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Y.size()",8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1," = ",3);
        poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::operator<<(poVar1,"\n");
      }
    }
    else {
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      local_6c.severity_ = ERR;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,
                 "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/data_structure.h"
                 ,"");
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"Serialize","");
      poVar1 = Logger::Start(ERR,&local_48,0x14f,&local_68);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"CHECK_EQ failed ",0x10);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/data_structure.h"
                 ,0x5c);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,":",1);
      poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,0x14f);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"row_length",10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," = ",3);
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"row.size()",10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," = ",3);
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::operator<<(poVar1,"\n");
    }
  }
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  Logger::~Logger(&local_6c);
  abort();
}

Assistant:

void Serialize(const std::string& filename) {
    CHECK_NE(filename.empty(), true);
    CHECK_EQ(row_length, row.size());
    CHECK_EQ(row_length, Y.size());
    CHECK_EQ(row_length, norm.size());
#ifndef _MSC_VER
    FILE* file = OpenFileOrDie(filename.c_str(), "w");
#else
    FILE* file = OpenFileOrDie(filename.c_str(), "wb");
#endif
    // Write hash_value
    WriteDataToDisk(file, (char*)&hash_value_1, sizeof(hash_value_1));
    WriteDataToDisk(file, (char*)&hash_value_2, sizeof(hash_value_2));
    // Write row_length
    WriteDataToDisk(file, (char*)&row_length, sizeof(row_length));
    // Write row
    for (size_t i = 0; i < row_length; ++i) {
      WriteVectorToFile(file, *(row[i]));
    }
    // Write Y
    WriteVectorToFile(file, Y);
    // Write norm
    WriteVectorToFile(file, norm);
    // Write has_label
    WriteDataToDisk(file, (char*)&has_label, sizeof(has_label));
    // Write pos
    WriteDataToDisk(file, (char*)&pos, sizeof(pos));
    Close(file);
  }